

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O0

string * __thiscall
flatbuffers::Namer::Type(string *__return_storage_ptr__,Namer *this,string *t,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *s_local;
  string *t_local;
  Namer *this_local;
  
  local_28 = s;
  s_local = t;
  t_local = (string *)this;
  this_local = (Namer *)__return_storage_ptr__;
  std::operator+(&local_68,t,"_");
  std::operator+(&local_48,&local_68,local_28);
  (*this->_vptr_Namer[0x14])(__return_storage_ptr__,this,&local_48,(ulong)(this->config_).types);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Type(const std::string &t, const std::string &s) const {
    return Format(t + "_" + s, config_.types);
  }